

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  int m;
  int v2;
  int v;
  int ke;
  int k;
  int tbl;
  int ci;
  int blkn;
  uchar *st;
  JBLOCKROW block;
  jpeg_component_info *compptr;
  arith_entropy_ptr entropy;
  int local_50;
  int local_4c;
  int local_48;
  int in_stack_ffffffffffffffbc;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  int local_34;
  short *st_00;
  j_compress_ptr cinfo_00;
  
  lVar1 = *(long *)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(lVar1 + 0x60) == 0) {
      emit_restart((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
      *(undefined4 *)(lVar1 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(lVar1 + 100) = *(int *)(lVar1 + 100) + 1;
      *(uint *)(lVar1 + 100) = *(uint *)(lVar1 + 100) & 7;
    }
    *(int *)(lVar1 + 0x60) = *(int *)(lVar1 + 0x60) + -1;
  }
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x170); local_34 = local_34 + 1) {
    st_00 = *(short **)(in_RSI + (long)local_34 * 8);
    iVar6 = *(int *)(in_RDI + 0x174 + (long)local_34 * 4);
    cinfo_00 = *(j_compress_ptr *)(in_RDI + 0x148 + (long)iVar6 * 8);
    iVar4 = *(int *)((long)&cinfo_00->progress + 4);
    lVar2 = *(long *)(lVar1 + 0x68 + (long)iVar4 * 8) +
            (long)*(int *)(lVar1 + 0x50 + (long)iVar6 * 4);
    local_48 = (int)*st_00 - *(int *)(lVar1 + 0x40 + (long)iVar6 * 4);
    iVar5 = (int)((ulong)lVar2 >> 0x20);
    if (local_48 == 0) {
      arith_encode(cinfo_00,(uchar *)st_00,iVar5);
      *(undefined4 *)(lVar1 + 0x50 + (long)iVar6 * 4) = 0;
    }
    else {
      *(int *)(lVar1 + 0x40 + (long)iVar6 * 4) = (int)*st_00;
      arith_encode(cinfo_00,(uchar *)st_00,iVar5);
      iVar5 = (int)((ulong)lVar2 >> 0x20);
      if (local_48 < 1) {
        local_48 = -local_48;
        arith_encode(cinfo_00,(uchar *)st_00,iVar5);
        lVar2 = lVar2 + 3;
        *(undefined4 *)(lVar1 + 0x50 + (long)iVar6 * 4) = 8;
      }
      else {
        arith_encode(cinfo_00,(uchar *)st_00,iVar5);
        lVar2 = lVar2 + 2;
        *(undefined4 *)(lVar1 + 0x50 + (long)iVar6 * 4) = 4;
      }
      local_50 = 0;
      local_4c = local_48 + -1;
      if (local_4c != 0) {
        arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
        local_50 = 1;
        lVar2 = *(long *)(lVar1 + 0x68 + (long)iVar4 * 8) + 0x14;
        while (local_4c = local_4c >> 1, local_4c != 0) {
          arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
          local_50 = local_50 << 1;
          lVar2 = lVar2 + 1;
        }
      }
      arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
      if (local_50 < (int)((1L << (*(byte *)(in_RDI + 0xc0 + (long)iVar4) & 0x3f)) >> 1)) {
        *(undefined4 *)(lVar1 + 0x50 + (long)iVar6 * 4) = 0;
      }
      else if ((int)((1L << (*(byte *)(in_RDI + 0xd0 + (long)iVar4) & 0x3f)) >> 1) < local_50) {
        *(int *)(lVar1 + 0x50 + (long)iVar6 * 4) = *(int *)(lVar1 + 0x50 + (long)iVar6 * 4) + 8;
      }
      lVar2 = lVar2 + 0xe;
      while (local_50 = local_50 >> 1, local_50 != 0) {
        arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
      }
    }
    iVar6 = *(int *)&cinfo_00->client_data;
    iVar4 = 0x3f;
    while ((0 < iVar4 && (st_00[jpeg_natural_order[iVar4]] == 0))) {
      iVar4 = iVar4 + -1;
    }
    for (iVar5 = 1; iVar5 <= iVar4; iVar5 = iVar5 + 1) {
      lVar2 = *(long *)(lVar1 + 0xe8 + (long)iVar6 * 8) + (long)((iVar5 + -1) * 3);
      arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
      while( true ) {
        local_48 = (int)st_00[jpeg_natural_order[iVar5]];
        iVar3 = (int)((ulong)lVar2 >> 0x20);
        if (local_48 != 0) break;
        arith_encode(cinfo_00,(uchar *)st_00,iVar3);
        lVar2 = lVar2 + 3;
        iVar5 = iVar5 + 1;
      }
      arith_encode(cinfo_00,(uchar *)st_00,iVar3);
      iVar3 = (int)((ulong)lVar2 >> 0x20);
      if (local_48 < 1) {
        local_48 = -local_48;
        arith_encode(cinfo_00,(uchar *)st_00,iVar3);
      }
      else {
        arith_encode(cinfo_00,(uchar *)st_00,iVar3);
      }
      lVar2 = lVar2 + 2;
      local_50 = 0;
      if (local_48 + -1 != 0) {
        arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
        local_50 = 1;
        local_4c = local_48 + -1 >> 1;
        if (local_4c != 0) {
          arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
          local_50 = 2;
          iVar3 = 0xd9;
          if (iVar5 <= (int)(uint)*(byte *)(in_RDI + 0xe0 + (long)iVar6)) {
            iVar3 = 0xbd;
          }
          lVar2 = *(long *)(lVar1 + 0xe8 + (long)iVar6 * 8) + (long)iVar3;
          while (local_4c = local_4c >> 1, local_4c != 0) {
            arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
            local_50 = local_50 << 1;
            lVar2 = lVar2 + 1;
          }
        }
      }
      arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
      lVar2 = lVar2 + 0xe;
      while (local_50 = local_50 >> 1, local_50 != 0) {
        arith_encode(cinfo_00,(uchar *)st_00,(int)((ulong)lVar2 >> 0x20));
      }
    }
    if (iVar5 < 0x40) {
      arith_encode(cinfo_00,(uchar *)st_00,
                   (int)((ulong)(*(long *)(lVar1 + 0xe8 + (long)iVar6 * 8) +
                                (long)((iVar5 + -1) * 3)) >> 0x20));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;      /* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, st + 1, 0); /* Table F.4: SS = S0 + 1 */
        st += 2;                        /* Table F.4: SP = S0 + 2 */
        entropy->dc_context[ci] = 4;    /* small positive diff category */
      } else {
        v = -v;
        arith_encode(cinfo, st + 1, 1); /* Table F.4: SS = S0 + 1 */
        st += 3;                        /* Table F.4: SN = S0 + 3 */
        entropy->dc_context[ci] = 8;    /* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;    /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] += 8;   /* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    for (ke = DCTSIZE2 - 1; ke > 0; ke--)
      if ((*block)[jpeg_natural_order[ke]]) break;

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 1; k <= ke; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 0);       /* EOB decision */
      while ((v = (*block)[jpeg_natural_order[k]]) == 0) {
        arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
        v = -v;
        arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        if (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (v2 >>= 1) {
            arith_encode(cinfo, st, 1);
            m <<= 1;
            st += 1;
          }
        }
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k <= DCTSIZE2 - 1 */
    if (k <= DCTSIZE2 - 1) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}